

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O3

void pltcalc::getperiodweights(void)

{
  bool bVar1;
  FILE *__stream;
  size_t sVar2;
  mapped_type *pmVar3;
  Periods p;
  key_type local_2c;
  mapped_type local_28;
  mapped_type local_20;
  
  __stream = fopen("input/periods.bin","rb");
  if (__stream == (FILE *)0x0) {
    local_2c = 1;
    if (0 < no_of_periods_) {
      do {
        local_20 = 1.0 / (double)no_of_periods_;
        pmVar3 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)period_weights_,&local_2c);
        *pmVar3 = local_20;
        bVar1 = local_2c < no_of_periods_;
        local_2c = local_2c + 1;
      } while (bVar1);
    }
  }
  else {
    sVar2 = fread(&local_2c,0xc,1,__stream);
    if (sVar2 != 0) {
      do {
        local_20 = local_28;
        pmVar3 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)period_weights_,&local_2c);
        *pmVar3 = local_20;
        sVar2 = fread(&local_2c,0xc,1,__stream);
      } while (sVar2 != 0);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void getperiodweights()
	{

		FILE *fin = fopen(PERIODS_FILE, "rb");

		// If there is no periods file, period weights are reciprocal
		// of number of periods
		if (fin == nullptr) {
			for (int i = 1; i <= no_of_periods_; i++) {
				period_weights_[i] = 1 / (double)no_of_periods_;
			}
			return;
		}

		Periods p;
		while (fread(&p, sizeof(Periods), 1, fin) != 0){
			period_weights_[p.period_no] = p.weighting;
		}

		fclose(fin);

	}